

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmanager.h
# Opt level: O2

void __thiscall Memory::show(Memory *this)

{
  ostream *poVar1;
  string *psVar2;
  long lVar3;
  
  psVar2 = (string *)&this->Mem[0].name;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar3);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(psVar2 + 0x20));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(psVar2 + 0x24));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,psVar2);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(psVar2 + -0x28));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,psVar2 + -0x20);
    std::endl<char,std::char_traits<char>>(poVar1);
    psVar2 = psVar2 + 0x50;
  }
  return;
}

Assistant:

void show() { //显示内存数据
			for(int i=0; i<16; i++) {
				cout<<i<<" "<<Mem[i].sign<<" "<<Mem[i].thread_id<<" "<<Mem[i].name<<" "<<Mem[i].datasize<<" "<<Mem[i].message<<endl;
			}
		}